

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

int xmlXIncludeProcessTreeFlags(xmlNodePtr tree,int flags)

{
  _xmlDoc *p_Var1;
  int iVar2;
  xmlXIncludeCtxtPtr ctxt;
  
  iVar2 = -1;
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) &&
     (p_Var1 = tree->doc, p_Var1 != (_xmlDoc *)0x0)) {
    ctxt = (xmlXIncludeCtxtPtr)(*xmlMalloc)(0x88);
    if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
      ctxt = (xmlXIncludeCtxtPtr)0x0;
    }
    else {
      memset(ctxt,0,0x88);
      ctxt->doc = p_Var1;
      ctxt->nbErrors = 0;
      ctxt->incNr = 0;
      ctxt->incMax = 0;
      ctxt->incTab = (xmlXIncludeRefPtr *)0x0;
    }
    if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
      ctxt->parseFlags = flags;
      iVar2 = -1;
      if (tree->type != XML_NAMESPACE_DECL) {
        iVar2 = xmlXIncludeDoProcess(ctxt,tree);
      }
      if ((-1 < iVar2) && (0 < ctxt->nbErrors)) {
        iVar2 = -1;
      }
      xmlXIncludeFreeContext(ctxt);
    }
  }
  return iVar2;
}

Assistant:

int
xmlXIncludeProcessTreeFlags(xmlNodePtr tree, int flags) {
    xmlXIncludeCtxtPtr ctxt;
    int ret = 0;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL) ||
        (tree->doc == NULL))
	return(-1);
    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt == NULL)
	return(-1);
    xmlXIncludeSetFlags(ctxt, flags);
    ret = xmlXIncludeDoProcessRoot(ctxt, tree);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
	ret = -1;

    xmlXIncludeFreeContext(ctxt);
    return(ret);
}